

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::translateTouchCancel(QPointingDevice *device,ulong timestamp)

{
  bool bVar1;
  QPointingDevicePrivate *pQVar2;
  const_iterator pEVar3;
  QObject *value;
  QWidget **ppQVar4;
  QPointingDevice *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  QObject *target;
  QEventPoint *pt;
  EventPointData *epd;
  const_iterator __end1;
  const_iterator __begin1;
  mapped_container_type *__range1;
  QPointingDevicePrivate *devPriv;
  const_iterator widItEnd;
  const_iterator widIt;
  QSet<QWidget_*> widgetsNeedingCancel;
  QMutableTouchEvent touchEvent;
  QList<QEventPoint> *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef8;
  Type eventType;
  QWidget *target_00;
  QMutableTouchEvent *in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  const_iterator local_e0;
  undefined1 local_70 [24];
  QMutableTouchEvent local_58 [80];
  long local_8;
  
  eventType = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_58,0xaa,0x50);
  QGuiApplication::keyboardModifiers();
  memset(local_70,0,0x18);
  QList<QEventPoint>::QList((QList<QEventPoint> *)0x2d5af1);
  QMutableTouchEvent::QMutableTouchEvent
            (in_stack_ffffffffffffff00,eventType,in_RDI,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
             SUB84((ulong)in_stack_ffffffffffffff08 >> 0x20,0),in_stack_fffffffffffffee8);
  QList<QEventPoint>::~QList((QList<QEventPoint> *)0x2d5b21);
  QPointerEvent::setTimestamp((ulonglong)local_58);
  QSet<QWidget_*>::QSet((QSet<QWidget_*> *)0x2d5b4f);
  pQVar2 = QPointingDevicePrivate::get((QPointingDevice *)0x2d5b59);
  QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
  ::values((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
            *)(pQVar2 + 0xf0));
  local_e0 = QVLABase<QPointingDevicePrivate::EventPointData>::begin
                       ((QVLABase<QPointingDevicePrivate::EventPointData> *)0x2d5b8d);
  pEVar3 = QVLABase<QPointingDevicePrivate::EventPointData>::end
                     ((QVLABase<QPointingDevicePrivate::EventPointData> *)in_RDI);
  for (; local_e0 != pEVar3; local_e0 = local_e0 + 1) {
    in_stack_ffffffffffffff08 = local_e0;
    value = QMutableEventPoint::target((QEventPoint *)0x2d5bed);
    if ((value != (QObject *)0x0) && (bVar1 = QObject::isWidgetType((QObject *)0x2d5c04), bVar1)) {
      QSet<QWidget_*>::insert((QSet<QWidget_*> *)in_stack_ffffffffffffff08,(QWidget **)value);
    }
  }
  QSet<QWidget_*>::constBegin((QSet<QWidget_*> *)in_stack_ffffffffffffff08);
  QSet<QWidget_*>::constEnd((QSet<QWidget_*> *)in_stack_ffffffffffffff08);
  while (bVar1 = QSet<QWidget_*>::const_iterator::operator!=
                           ((const_iterator *)in_RDI,(const_iterator *)in_stack_fffffffffffffee8),
        bVar1) {
    ppQVar4 = QSet<QWidget_*>::const_iterator::operator*((const_iterator *)0x2d5cbf);
    target_00 = *ppQVar4;
    QMutableTouchEvent::setTarget(local_58,&target_00->super_QObject);
    QCoreApplication::sendSpontaneousEvent(&target_00->super_QObject,(QEvent *)local_58);
    QSet<QWidget_*>::const_iterator::operator++((const_iterator *)in_RDI);
  }
  QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x2d5d04);
  QMutableTouchEvent::~QMutableTouchEvent(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::translateTouchCancel(const QPointingDevice *device, ulong timestamp)
{
    QMutableTouchEvent touchEvent(QEvent::TouchCancel, device, QGuiApplication::keyboardModifiers());
    touchEvent.setTimestamp(timestamp);

    QSet<QWidget *> widgetsNeedingCancel;
    const QPointingDevicePrivate *devPriv = QPointingDevicePrivate::get(device);
    for (auto &epd : devPriv->activePoints.values()) {
        const auto &pt = epd.eventPoint;
        QObject *target = QMutableEventPoint::target(pt);
        if (target && target->isWidgetType())
            widgetsNeedingCancel.insert(static_cast<QWidget *>(target));
    }
    for (QSet<QWidget *>::const_iterator widIt = widgetsNeedingCancel.constBegin(),
         widItEnd = widgetsNeedingCancel.constEnd(); widIt != widItEnd; ++widIt) {
        QWidget *widget = *widIt;
        touchEvent.setTarget(widget);
        QApplication::sendSpontaneousEvent(widget, &touchEvent);
    }
}